

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtest.cc
# Opt level: O1

void test_median(GlobalArray *g_a,GlobalArray *g_b,GlobalArray *g_c,GlobalArray *g_m)

{
  double dVar1;
  GlobalArray *this;
  GlobalArray *this_00;
  double *val;
  int *type_00;
  char *message;
  undefined8 *unaff_R14;
  double *val_00;
  uint uVar2;
  ulong uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int type;
  float fval3;
  int ival3;
  float fval2;
  int ival2;
  float fval;
  int ival;
  float bf;
  float af;
  int bi;
  int ai;
  float fmax;
  float fmin;
  int imax;
  int imin;
  long lval3;
  double dval3;
  long lval2;
  double dval2;
  long lval;
  double dval;
  double bd;
  double ad;
  long bl;
  long al;
  double dmax;
  double dmin;
  long lmax;
  long lmin;
  int ndim;
  DoubleComplex dcmax;
  DoubleComplex dcmin;
  DoubleComplex bdc;
  DoubleComplex adc;
  int dims [7];
  int index [7];
  int local_1c0;
  int local_1bc;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined4 local_1a0;
  undefined4 local_19c;
  int local_198 [2];
  undefined1 local_190 [8];
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  undefined4 local_17c;
  float local_178;
  float local_174;
  int local_170;
  int local_16c;
  GlobalArray *local_168;
  undefined8 local_160;
  undefined8 local_158;
  int local_150 [4];
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  int local_ec;
  double local_e8 [2];
  double local_d8;
  double local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  int local_b8 [4];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  int local_78 [8];
  int local_58 [10];
  
  local_17c = 1;
  local_180 = 0xffffffff;
  local_118 = 1;
  local_120 = 0xffffffffffffffff;
  local_184 = 0x3f800000;
  local_188 = 0xbf800000;
  local_128 = 0x3ff0000000000000;
  local_130 = 0xbff0000000000000;
  local_88 = 0x3ff0000000000000;
  uStack_80 = 0;
  local_98 = 0xbff0000000000000;
  uStack_90 = 0;
  local_190._4_4_ = 0xfffffffe;
  local_138 = 0xc000000000000000;
  local_190._0_4_ = 0xc0000000;
  local_140 = 0xfffffffffffffffe;
  local_198[1] = 6;
  local_150[2] = 0;
  local_150[3] = 0x40180000;
  local_198[0] = 0x40c00000;
  local_150[0] = 6;
  local_150[1] = 0;
  local_19c = 4;
  local_158 = 0x4010000000000000;
  local_1a0 = 0x40800000;
  local_160 = 4;
  local_168 = g_m;
  local_1bc = GA_Nodeid();
  type_00 = &local_1c0;
  GA::GlobalArray::inquire(g_a,type_00,&local_ec,local_78);
  switch(local_1c0) {
  case 0x3e9:
    local_1a8 = (undefined8 *)&local_17c;
    local_1b0 = (undefined8 *)&local_180;
    break;
  case 0x3ea:
    local_1a8 = &local_118;
    local_1b0 = &local_120;
    break;
  case 0x3eb:
    local_1a8 = (undefined8 *)&local_184;
    local_1b0 = (undefined8 *)&local_188;
    break;
  case 0x3ec:
    local_1a8 = &local_128;
    local_1b0 = &local_130;
    break;
  default:
    GA::GAServices::error((GAServices *)&GA::SERVICES,"test_median:wrong data type.",local_1c0);
  case 0x3ef:
    local_1a8 = &local_88;
    local_1b0 = &local_98;
  }
  local_a8 = 0xc000000000000000;
  uStack_a0 = 0x8000000000000000;
  local_b8[0] = 0;
  local_b8[1] = 0x40180000;
  local_b8[2] = 0;
  local_b8[3] = 0;
  local_c8 = 0x4010000000000000;
  uStack_c0 = 0;
  switch(local_1c0) {
  case 0x3e9:
    local_1b8 = (undefined8 *)&local_19c;
    type_00 = local_198 + 1;
    unaff_R14 = (undefined8 *)(local_190 + 4);
    break;
  case 0x3ea:
    local_1b8 = &local_160;
    type_00 = local_150;
    unaff_R14 = &local_140;
    break;
  case 0x3eb:
    local_1b8 = (undefined8 *)&local_1a0;
    type_00 = local_198;
    unaff_R14 = (undefined8 *)local_190;
    break;
  case 0x3ec:
    local_1b8 = &local_158;
    type_00 = local_150 + 2;
    unaff_R14 = &local_138;
    break;
  default:
    GA_Error("test_median:test_median:wrong data type.",local_1c0);
    break;
  case 0x3ef:
    local_1b8 = &local_c8;
    type_00 = local_b8;
    unaff_R14 = &local_a8;
  }
  if (local_1bc == 0) {
    printf("Testing GA_Median...");
  }
  GA::GlobalArray::zero(g_a);
  GA::GlobalArray::zero(g_b);
  GA::GlobalArray::zero(g_c);
  this = local_168;
  GA::GlobalArray::zero(local_168);
  GA::GlobalArray::fill(g_a,unaff_R14);
  GA::GlobalArray::fill(g_b,type_00);
  GA::GlobalArray::fill(g_c,local_1b8);
  GA::GlobalArray::median(this,g_a,g_b,g_c);
  this_00 = GA::GAServices::createGA((GAServices *)&GA::SERVICES,g_a,"E");
  GA::GlobalArray::add(this_00,local_1a8,g_c,local_1b0,this);
  switch(local_1c0) {
  case 0x3e9:
    val_00 = (double *)&local_16c;
    val = (double *)&local_170;
    break;
  case 0x3ea:
    val_00 = &local_f8;
    val = &local_100;
    break;
  case 0x3eb:
    val_00 = (double *)&local_174;
    val = (double *)&local_178;
    break;
  case 0x3ec:
    val_00 = &local_108;
    val = &local_110;
    break;
  default:
    test_median();
  case 0x3ef:
    val_00 = &local_d8;
    val = local_e8;
  }
  GA::GlobalArray::selectElem(this_00,"max",val,local_58);
  GA::GlobalArray::selectElem(this_00,"min",val_00,local_58);
  switch(local_1c0) {
  case 0x3e9:
    if (local_1bc != 0) {
      return;
    }
    if (local_16c == 0 && local_170 == 0) goto LAB_001054d5;
    break;
  case 0x3ea:
    if (local_1bc != 0) {
      return;
    }
    if (local_f8 == 0.0 && local_100 == 0.0) goto LAB_001054d5;
    break;
  case 0x3eb:
    if (local_1bc != 0) {
      return;
    }
    if (((local_174 == 0.0) && (local_178 == 0.0)) &&
       ((!NAN(local_178) &&
        (local_178 = local_178 - local_174, uVar2 = -(uint)(local_178 < -local_178),
        (float)(~uVar2 & (uint)local_178 | (uint)-local_178 & uVar2) < 1e-05)))) goto LAB_001054d5;
    break;
  case 0x3ec:
    if (local_1bc != 0) {
      return;
    }
    uVar6 = SUB84(local_108,0);
    uVar7 = (undefined4)((ulong)local_108 >> 0x20);
    if ((local_108 == 0.0) && (!NAN(local_108))) {
      uVar4 = SUB84(local_110,0);
      uVar5 = (undefined4)((ulong)local_110 >> 0x20);
LAB_0010549e:
      if ((((double)CONCAT44(uVar5,uVar4) == 0.0) && (!NAN((double)CONCAT44(uVar5,uVar4)))) &&
         (dVar1 = (double)CONCAT44(uVar5,uVar4) - (double)CONCAT44(uVar7,uVar6),
         uVar3 = -(ulong)(dVar1 < -dVar1),
         (double)(~uVar3 & (ulong)dVar1 | (ulong)-dVar1 & uVar3) < 1e-05)) {
LAB_001054d5:
        puts("ok.");
        return;
      }
    }
    break;
  default:
    message = "test_median:wrong data type.";
    goto LAB_00105501;
  case 0x3ef:
    if (local_1bc != 0) {
      return;
    }
    if ((((local_d8 == 0.0) && (!NAN(local_d8))) && (local_e8[0] == 0.0)) &&
       ((!NAN(local_e8[0]) &&
        (local_e8[0] = local_e8[0] - local_d8, uVar3 = -(ulong)(local_e8[0] < -local_e8[0]),
        (double)(~uVar3 & (ulong)local_e8[0] | (ulong)-local_e8[0] & uVar3) < 1e-05)))) {
      uVar6 = SUB84(local_d0,0);
      uVar7 = (undefined4)((ulong)local_d0 >> 0x20);
      if ((local_d0 == 0.0) && (!NAN(local_d0))) {
        uVar4 = SUB84(local_e8[1],0);
        uVar5 = (undefined4)((ulong)local_e8[1] >> 0x20);
        goto LAB_0010549e;
      }
    }
  }
  puts("not ok.");
  message = "test_median:mismatched.";
LAB_00105501:
  GA::GAServices::error((GAServices *)&GA::SERVICES,message,local_1c0);
}

Assistant:

void 
test_median (GA::GlobalArray * g_a, GA::GlobalArray * g_b,
	     GA::GlobalArray * g_c, GA::GlobalArray * g_m)
{
  
  GA::GlobalArray *g_e;
  int index[MAXDIM];
  void *min, *max;
  int imin, imax;
  float fmin, fmax;
  long lmin, lmax;
  double dmin, dmax;
  DoubleComplex dcmin, dcmax;


  void *alpha, *beta;
  int ai = 1, bi = -1;
  long al = 1, bl = -1;
  float af = 1.0, bf = -1.0;
  double ad = 1.0, bd = -1.0;
  DoubleComplex adc = { 1.0, 0.0 };
  DoubleComplex bdc = {-1.0, 0.0 };

  void *val;
  int ival = -2;
  double dval = -2.0;
  float fval = -2.0;
  long lval = -2;
  DoubleComplex dcval;

  void *val2;
  int ival2 = 6;
  double dval2 = 6.0;
  float fval2 = 6.0;
  long lval2 = 6;
  DoubleComplex dcval2;

  void *val3;
  int ival3 = 4;
  double dval3 = 4.0;
  float fval3 = 4.0;
  long lval3 = 4;
  DoubleComplex dcval3;

  int me = GA_Nodeid ();
  int type, ndim, dims[MAXDIM];

  g_a->inquire (&type, &ndim, dims);

  switch (type)
    {
    case C_INT:
      alpha = (void *)&ai;
      beta = (void *)&bi;
      break;
    case C_DCPL:
      alpha = (void *)&adc;
      beta =(void *) &bdc;
      break;

    case C_DBL:
      alpha = (void *)&ad;
      beta = (void *)&bd;
      break;
    case C_FLOAT:
      alpha =(void *) &af;
      beta = (void *)&bf;
      break;
    case C_LONG:
      alpha = (void *)&al;
      beta = (void *)&bl;
      break;
    default:
      GA::SERVICES.error ((char *)"test_median:wrong data type.", type);
    }

  dcval.real = -2.0;
  dcval.imag = -0.0;

  dcval2.real = 6.0;
  dcval2.imag = 0.0;


  dcval3.real = 4.0;
  dcval3.imag = 0.0;


  switch (type)
    {
    case C_INT:
      val = (void *)&ival;
      val2 =(void *) &ival2;
      val3 = (void *)&ival3;
      break;
    case C_DCPL:
      val = (void *)&dcval;
      val2 =(void *) &dcval2;
      val3 =(void *) &dcval3;
      break;
    case C_DBL:
      val = (void *)&dval;
      val2 = (void *)&dval2;
      val3 = (void *)&dval3;
      break;
    case C_FLOAT:
      val = (void *)&fval;
      val2 = (void *)&fval2;
      val3 = (void *)&fval3;
      break;
    case C_LONG:
      val = (void *)&lval;
      val2 = (void *)&lval2;
      val3 = (void *)&lval3;
      break;
    default:
      GA_Error ((char *)"test_median:test_median:wrong data type.", type);
    }

  if (me == 0)
    printf ("Testing GA_Median...");

  g_a->zero();
  g_b->zero();
  g_c->zero();
  g_m->zero();

  g_a->fill (val);
  g_b->fill (val2);
  g_c->fill (val3);

  g_m->median (g_a, g_b, g_c);
  
  /*
    The result array should        be g_c due to the value I chose: 
    val3 is the median of the three values val, val2, and val3
  */

  /* g_e = g_c - g_m */
  g_e = GA::SERVICES.createGA (g_a, (char *)"E");
  g_e->add (alpha, g_c, beta, g_m);
  
  switch (type)
    {
    case C_INT:
      max =(void *) &imax;
      min = (void *)&imin;
      break;
    case C_DCPL:
      max =(void *) &dcmax;
      min = (void *)&dcmin;
      break;
    case C_DBL:
      max = (void *)&dmax;
      min = (void *)&dmin;
      break;
    case C_FLOAT:
      max = (void *)&fmax;
      min = (void *)&fmin;
      break;
    case C_LONG:
      max = (void *)&lmax;
      min = (void *)&lmin;
      break;
    default:
      GA::SERVICES.error ((char *)"test_median:wrong data type.", type);
    }
  
  g_e->selectElem ((char *)"max", max, index);
  g_e->selectElem ((char *)"min", min, index);

  switch (type)
    {
      double r, m;
    case C_INT:
      if (me == 0)
	{
	  if (MISMATCHED (imax, imin) || (imax != 0) || (imin != 0)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_DCPL:
      r = dcmax.real - dcmin.real;
      m = dcmax.imag - dcmin.imag;
      if (me == 0)
	{
	  if (MISMATCHED (dcmax.real, dcmin.real) || (dcmax.real != 0.0)
	      || (dcmin.real != 0.0) || MISMATCHED (dcmax.imag, dcmin.imag)
	      || (dcmax.imag != 0.0) || (dcmin.imag != 0.0)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_DBL:
      if (me == 0)
	{
	  if (MISMATCHED (dmax, dmin) || (dmax != 0) || (dmin != 0)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_FLOAT:
      if (me == 0)
	{
	  if (MISMATCHED (fmax, fmin) || (fmax != 0) || (fmin != 0)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    case C_LONG:
      if (me == 0)
	{
	  if (MISMATCHED (lmax, lmin) || (lmax != 0) || (lmin != 0)) {
	    printf ("not ok.\n");
        GA::SERVICES.error ((char *)"test_median:mismatched.", type);
      }
	  else {
	    printf ("ok.\n");
      }
	}
      break;
    default:
      GA::SERVICES.error ((char *)"test_median:wrong data type.", type);
    }


}